

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_add_slow(JSContext *ctx,JSValue *sp)

{
  JSValue *pJVar1;
  JSValue *pJVar2;
  JSValue val;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_8_2_94730072 u;
  double dVar7;
  JSValue op1;
  JSValue op2;
  JSValue JVar8;
  double d2;
  double d1;
  
  pJVar1 = sp + -2;
  pJVar2 = sp + -1;
  val = *pJVar2;
  JVar8 = *pJVar2;
  iVar3 = (int)sp[-2].tag;
  if (((iVar3 == 7) || (iVar3 == 0)) &&
     ((iVar3 = (int)sp[-1].tag, op1 = *pJVar1, op2 = *pJVar2, iVar3 == 0 ||
      (op1 = *pJVar1, op2 = *pJVar2, iVar3 == 7)))) {
LAB_00131d13:
    JVar8 = op2;
    iVar3 = JS_ToFloat64Free(ctx,&d1,op1);
    if (iVar3 == 0) {
      iVar3 = JS_ToFloat64Free(ctx,&d2,JVar8);
      if (iVar3 == 0) {
        dVar7 = d1 + d2;
        uVar5 = (ulong)dVar7 & 0xffffffff;
        uVar6 = (ulong)dVar7 & 0xffffffff00000000;
        if (dVar7 == (double)(int)dVar7) {
          uVar5 = (ulong)(uint)(int)dVar7;
          uVar6 = 0;
        }
        uVar4 = 7;
        if (dVar7 == (double)(int)dVar7) {
          uVar4 = 0;
        }
        sp[-2].u.ptr = (void *)(uVar5 | uVar6);
        sp[-2].tag = uVar4;
        return 0;
      }
      goto LAB_00131d38;
    }
  }
  else {
    op1 = JS_ToPrimitiveFree(ctx,*pJVar1,2);
    if (((op1.tag & 0xffffffffU) != 6) &&
       (op2 = JS_ToPrimitiveFree(ctx,val,2), JVar8 = op1, (op2.tag & 0xffffffffU) != 6)) {
      if (((int)op1.tag == -7) || ((int)op2.tag == -7)) {
        JVar8 = JS_ConcatString(ctx,op1,op2);
        sp[-2] = JVar8;
        if ((int)JVar8.tag != 6) {
          return 0;
        }
        goto LAB_00131d38;
      }
      goto LAB_00131d13;
    }
  }
  JS_FreeValue(ctx,JVar8);
LAB_00131d38:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

int js_add_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t tag1, tag2;

    op1 = sp[-2];
    op2 = sp[-1];
    tag1 = JS_VALUE_GET_TAG(op1);
    tag2 = JS_VALUE_GET_TAG(op2);
    if ((tag1 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag1)) &&
        (tag2 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag2))) {
        goto add_numbers;
    } else {
        op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NONE);
        if (JS_IsException(op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NONE);
        if (JS_IsException(op2)) {
            JS_FreeValue(ctx, op1);
            goto exception;
        }
        tag1 = JS_VALUE_GET_TAG(op1);
        tag2 = JS_VALUE_GET_TAG(op2);
        if (tag1 == JS_TAG_STRING || tag2 == JS_TAG_STRING) {
            sp[-2] = JS_ConcatString(ctx, op1, op2);
            if (JS_IsException(sp[-2]))
                goto exception;
        } else {
            double d1, d2;
        add_numbers:
            if (JS_ToFloat64Free(ctx, &d1, op1)) {
                JS_FreeValue(ctx, op2);
                goto exception;
            }
            if (JS_ToFloat64Free(ctx, &d2, op2))
                goto exception;
            sp[-2] = JS_NewFloat64(ctx, d1 + d2);
        }
    }
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}